

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__process_marker(stbi__jpeg *z,int m)

{
  long lVar1;
  byte bVar2;
  stbi_uc sVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int in_ESI;
  undefined8 *in_RDI;
  int th;
  int tc;
  int q_1;
  int n;
  int i_1;
  int sizes [16];
  stbi_uc *v;
  int i;
  int t;
  int p;
  int q;
  int L;
  stbi__context *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff74;
  int iVar7;
  stbi__huffman *in_stack_ffffffffffffff88;
  undefined8 *local_30;
  int local_28;
  int local_18;
  uint local_4;
  
  if (in_ESI == 0xc4) {
    local_18 = stbi__get16be((stbi__context *)CONCAT44(in_stack_ffffffffffffff74,0xc4));
    for (local_18 = local_18 + -2; 0 < local_18; local_18 = (local_18 + -0x11) - iVar4) {
      iVar4 = 0;
      bVar2 = stbi__get8(in_stack_ffffffffffffff68);
      uVar5 = (int)(uint)bVar2 >> 4;
      uVar6 = bVar2 & 0xf;
      if ((1 < uVar5) || (3 < uVar6)) {
        iVar4 = stbi__err("bad DHT header");
        return iVar4;
      }
      for (iVar7 = 0; iVar7 < 0x10; iVar7 = iVar7 + 1) {
        bVar2 = stbi__get8(in_stack_ffffffffffffff68);
        *(uint *)(&stack0xffffffffffffff88 + (long)iVar7 * 4) = (uint)bVar2;
        iVar4 = *(int *)(&stack0xffffffffffffff88 + (long)iVar7 * 4) + iVar4;
      }
      if (uVar5 == 0) {
        iVar7 = stbi__build_huffman(in_stack_ffffffffffffff88,(int *)CONCAT44(iVar7,iVar4));
        if (iVar7 == 0) {
          return 0;
        }
        lVar1 = (long)(int)uVar6 * 0xd2 + 0x81;
      }
      else {
        iVar7 = stbi__build_huffman(in_stack_ffffffffffffff88,(int *)CONCAT44(iVar7,iVar4));
        if (iVar7 == 0) {
          return 0;
        }
        lVar1 = (long)(int)uVar6 * 0xd2 + 0x3c9;
      }
      local_30 = in_RDI + lVar1;
      for (iVar7 = 0; iVar7 < iVar4; iVar7 = iVar7 + 1) {
        sVar3 = stbi__get8(in_stack_ffffffffffffff68);
        *(stbi_uc *)((long)local_30 + (long)iVar7) = sVar3;
      }
      if (uVar5 != 0) {
        stbi__build_fast_ac((stbi__int16 *)(in_RDI + (long)(int)uVar6 * 0x80 + 0x6b1),
                            (stbi__huffman *)(in_RDI + (long)(int)uVar6 * 0xd2 + 0x349));
      }
    }
    local_4 = (uint)(local_18 == 0);
  }
  else if (in_ESI == 0xdb) {
    local_18 = stbi__get16be((stbi__context *)CONCAT44(in_stack_ffffffffffffff74,0xdb));
    for (local_18 = local_18 + -2; 0 < local_18; local_18 = local_18 + -0x41) {
      bVar2 = stbi__get8(in_stack_ffffffffffffff68);
      uVar5 = bVar2 & 0xf;
      if ((int)(uint)bVar2 >> 4 != 0) {
        iVar4 = stbi__err("bad DQT type");
        return iVar4;
      }
      if (3 < uVar5) {
        iVar4 = stbi__err("bad DQT table");
        return iVar4;
      }
      for (local_28 = 0; local_28 < 0x40; local_28 = local_28 + 1) {
        sVar3 = stbi__get8(in_stack_ffffffffffffff68);
        *(stbi_uc *)
         ((long)in_RDI + (ulong)stbi__jpeg_dezigzag[local_28] + (long)(int)uVar5 * 0x40 + 0x3488) =
             sVar3;
      }
    }
    local_4 = (uint)(local_18 == 0);
  }
  else if (in_ESI == 0xdd) {
    iVar4 = stbi__get16be((stbi__context *)CONCAT44(in_stack_ffffffffffffff74,0xdd));
    if (iVar4 == 4) {
      iVar4 = stbi__get16be((stbi__context *)CONCAT44(in_stack_ffffffffffffff74,in_ESI));
      *(int *)((long)in_RDI + 0x475c) = iVar4;
      local_4 = 1;
    }
    else {
      local_4 = stbi__err("bad DRI len");
    }
  }
  else if (in_ESI == 0xff) {
    local_4 = stbi__err("expected marker");
  }
  else if (((in_ESI < 0xe0) || (0xef < in_ESI)) && (in_ESI != 0xfe)) {
    local_4 = 0;
  }
  else {
    iVar4 = (int)((ulong)*in_RDI >> 0x20);
    stbi__get16be((stbi__context *)CONCAT44(in_stack_ffffffffffffff74,in_ESI));
    stbi__skip((stbi__context *)CONCAT44(in_stack_ffffffffffffff74,in_ESI),iVar4);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4;
            int t = q & 15,i;
            if (p != 0) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");
            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = stbi__get8(z->s);
            L -= 65;
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }
   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      stbi__skip(z->s, stbi__get16be(z->s)-2);
      return 1;
   }
   return 0;
}